

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

NullableValue<kj::String> * __thiscall
kj::_::NullableValue<kj::String>::operator=
          (NullableValue<kj::String> *this,NullableValue<kj::String> *other)

{
  if (other != this) {
    if (this->isSet == true) {
      this->isSet = false;
      Array<char>::~Array(&(this->field_1).value.content);
    }
    if (other->isSet == true) {
      (this->field_1).value.content.ptr = (other->field_1).value.content.ptr;
      (this->field_1).value.content.size_ = (other->field_1).value.content.size_;
      (this->field_1).value.content.disposer = (other->field_1).value.content.disposer;
      (other->field_1).value.content.ptr = (char *)0x0;
      (other->field_1).value.content.size_ = 0;
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }